

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

int32_t effect_value_base_spell_power(void)

{
  monster *pmVar1;
  monster_race *pmVar2;
  
  pmVar2 = ref_race;
  if (ref_race == (monster_race *)0x0) {
    if (cave->mon_current < L'\x01') {
      return 0;
    }
    pmVar1 = cave_monster(cave,cave->mon_current);
    pmVar2 = pmVar1->race;
  }
  return pmVar2->spell_power;
}

Assistant:

static int32_t effect_value_base_spell_power(void)
{
	int power = 0;

	/* Check the reference race first */
	if (ref_race)
	   power = ref_race->spell_power;
	/* Otherwise the current monster if there is one */
	else if (cave->mon_current > 0)
		power = cave_monster(cave, cave->mon_current)->race->spell_power;

	return power;
}